

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

bool __thiscall VertexAttrib64Bit::LimitTest::verifyResult(LimitTest *this,bool use_instancing)

{
  ostringstream *this_00;
  ostringstream *this_01;
  int iVar1;
  GLenum GVar2;
  void *pvVar3;
  TestError *this_02;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  long local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pvVar3 = (*(this->super_Base).gl.mapBuffer)(0x8c8e,35000);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xb8e);
  if (pvVar3 == (void *)0x0) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Failed to map GL_TRANSFORM_FEEDBACK_BUFFER buffer",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
               ,0xb92);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar4 = 1;
  if (use_instancing) {
    lVar4 = 0x10;
  }
  bVar6 = true;
  local_1d0 = 0;
  do {
    uVar5 = 0;
    bVar7 = false;
    do {
      iVar1 = *(int *)((long)pvVar3 + uVar5 * 4);
      if (iVar1 != 1) {
        if (use_instancing) {
          local_1b0._0_8_ = (this->super_Base).m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Failure. Instance: ",0x13);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Vertex: ",9);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_1b0._0_8_ = (this->super_Base).m_log;
          this_01 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,"Failure. Vertex: ",0x11);
          std::ostream::_M_insert<unsigned_long>((ulong)this_01);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        bVar6 = false;
      }
      if (iVar1 != 1) break;
      bVar7 = 0x3fe < uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x400);
    if (!bVar7) break;
    local_1d0 = local_1d0 + 1;
    pvVar3 = (void *)((long)pvVar3 + 0x1000);
  } while (local_1d0 != lVar4);
  (*(this->super_Base).gl.unmapBuffer)(0x8c8e);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xbb6);
  return bVar6;
}

Assistant:

bool LimitTest::verifyResult(bool use_instancing) const
{
	_varyingType* buffer_data = (_varyingType*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	const GLuint  n_instances = (true == use_instancing) ? m_n_instances : 1;
	bool		  result	  = true;

	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	if (0 == buffer_data)
	{
		TCU_FAIL("Failed to map GL_TRANSFORM_FEEDBACK_BUFFER buffer");
	}

	/* For each instance */
	for (GLuint instance = 0; instance < n_instances; ++instance)
	{
		const GLuint instance_offset = instance * m_n_vertices * m_n_varyings;

		/* For each vertex */
		for (GLuint vertex = 0; vertex < m_n_vertices; ++vertex)
		{
			const GLuint vertex_offset = vertex * m_n_varyings;

			if (1 != buffer_data[vertex_offset + instance_offset])
			{
				if (true == use_instancing)
				{
					m_log << tcu::TestLog::Message << "Failure. Instance: " << instance << " Vertex: " << vertex
						  << tcu::TestLog::EndMessage;
				}
				else
				{
					m_log << tcu::TestLog::Message << "Failure. Vertex: " << vertex << tcu::TestLog::EndMessage;
				}

				/* Save failure and break loop */
				result = false;

				/* Sorry about that, but this is nested loop */
				goto end;
			}
		}
	}

end:
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	return result;
}